

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O0

id objc_begin_catch(_Unwind_Exception *exceptionObject)

{
  thread_data *ptVar1;
  objc_exception *poVar2;
  Class receiver;
  SEL selector;
  IMP p_Var3;
  id boxed;
  _func_id_Class_SEL__Unwind_Exception_ptr *boxfunction;
  SEL box_sel;
  Class thrown_class;
  objc_exception *ex;
  thread_data *td;
  _Unwind_Exception *exceptionObject_local;
  
  ptVar1 = get_thread_data();
  ptVar1->cxxCaughtException = '\0';
  if (exceptionObject->exception_class == 0x474e55434f424a43) {
    ptVar1->current_exception_type = OBJC;
    poVar2 = objc_exception_from_header(exceptionObject);
    if (poVar2->catch_count == 0) {
      poVar2->catch_count = 1;
      poVar2->next = ptVar1->caughtExceptions;
      ptVar1->caughtExceptions = poVar2;
    }
    else if (poVar2->catch_count < 0) {
      poVar2->catch_count = 1 - poVar2->catch_count;
    }
    else {
      poVar2->catch_count = poVar2->catch_count + 1;
    }
    exceptionObject_local = (_Unwind_Exception *)poVar2->object;
  }
  else {
    if (ptVar1->caughtExceptions != (objc_exception *)0x0) {
      abort();
    }
    if (exceptionObject->exception_class == cxx_exception_class) {
      ptVar1->current_exception_type = CXX;
      exceptionObject_local = (_Unwind_Exception *)__cxa_begin_catch(exceptionObject);
    }
    else {
      if (_objc_class_for_boxing_foreign_exception != (_func_Class_int64_t *)0x0) {
        receiver = (*_objc_class_for_boxing_foreign_exception)(exceptionObject->exception_class);
        selector = sel_registerName("exceptionWithForeignException:");
        p_Var3 = objc_msg_lookup((id)receiver,selector);
        if (p_Var3 != (IMP)0x0) {
          poVar2 = (objc_exception *)(*p_Var3)((id)receiver,selector,exceptionObject);
          ptVar1->caughtExceptions = poVar2;
          ptVar1->current_exception_type = BOXED_FOREIGN;
          return (id)poVar2;
        }
      }
      ptVar1->current_exception_type = FOREIGN;
      ptVar1->caughtExceptions = (objc_exception *)exceptionObject;
      exceptionObject_local = exceptionObject + 1;
    }
  }
  return (id)exceptionObject_local;
}

Assistant:

OBJC_PUBLIC id objc_begin_catch(struct _Unwind_Exception *exceptionObject)
{
	struct thread_data *td = get_thread_data();
	DEBUG_LOG("Beginning catch %p\n", exceptionObject);
	td->cxxCaughtException = NO;
	if (exceptionObject->exception_class == objc_exception_class)
	{
		td->current_exception_type = OBJC;
		struct objc_exception *ex = objc_exception_from_header(exceptionObject);
		if (ex->catch_count == 0)
		{
			// If this is the first catch, add it to the list.
			ex->catch_count = 1;
			ex->next = td->caughtExceptions;
			td->caughtExceptions = ex;
		}
		else if (ex->catch_count < 0)
		{
			// If this is being thrown, mark it as caught again and increment
			// the refcount
			ex->catch_count = -ex->catch_count + 1;
		}
		else
		{
			// Otherwise, just increment the catch count
			ex->catch_count++;
		}
		DEBUG_LOG("objc catch\n");
		return ex->object;
	}
	// If we have a foreign exception while we have stacked exceptions, we have
	// a problem.  We can't chain them, so we follow the example of C++ and
	// just abort.
	if (td->caughtExceptions != 0)
	{
		// FIXME: Actually, we can handle a C++ exception if only ObjC
		// exceptions are in-flight
		abort();
	}
#ifndef NO_OBJCXX
	// If this is a C++ exception, let the C++ runtime handle it.
	if (exceptionObject->exception_class == cxx_exception_class)
	{
		DEBUG_LOG("c++ catch\n");
		td->current_exception_type = CXX;
		return __cxa_begin_catch(exceptionObject);
	}
#endif
	DEBUG_LOG("foreign exception catch\n");
	// Box if we have a boxing function.
	if (_objc_class_for_boxing_foreign_exception)
	{
		Class thrown_class =
			_objc_class_for_boxing_foreign_exception(exceptionObject->exception_class);
		SEL box_sel = sel_registerName("exceptionWithForeignException:");
		id(*boxfunction)(Class,SEL,struct _Unwind_Exception*) = 
			(id(*)(Class,SEL,struct _Unwind_Exception*))objc_msg_lookup((id)thrown_class, box_sel);
		if (boxfunction != 0)
		{
			id boxed = boxfunction(thrown_class, box_sel, exceptionObject);
			td->caughtExceptions = (struct objc_exception*)boxed;
			td->current_exception_type = BOXED_FOREIGN;
			return boxed;
		}
	}
	td->current_exception_type = FOREIGN;
	td->caughtExceptions = (struct objc_exception*)exceptionObject;
	// If this is some other kind of exception, then assume that the value is
	// at the end of the exception header.
	return (id)((char*)exceptionObject + sizeof(struct _Unwind_Exception));
}